

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

bool __thiscall Parser::dcl(Parser *this)

{
  bool bVar1;
  FunctionNode *f;
  FunctionNode *local_10;
  
  bVar1 = is_builtin_type(this);
  if ((bVar1) && (local_10 = function_definition(this), local_10 != (FunctionNode *)0x0)) {
    std::vector<FunctionNode_*,_std::allocator<FunctionNode_*>_>::push_back
              (&(this->data).functions,&local_10);
    return true;
  }
  return false;
}

Assistant:

bool Parser::dcl()
{
  if (is_builtin_type()) {
    FunctionNode* f = function_definition();
    if (f) {
      data.functions.push_back(f);
      return true;
    }
  }

  return false;
}